

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O0

void duckdb::ColumnDataCopyArray
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  VectorDataIndex index;
  bool bVar1;
  VectorType VVar2;
  VectorMetaData *pVVar3;
  TemplatedValidityMask<unsigned_long> *this;
  long in_RCX;
  Vector *in_RDX;
  undefined8 *in_RSI;
  ColumnDataMetaData *in_RDI;
  ulong in_R8;
  idx_t i_1;
  bool is_constant;
  idx_t j;
  idx_t source_idx;
  idx_t i;
  ColumnDataMetaData child_meta_data;
  UnifiedVectorFormat child_vector_data;
  VectorMetaData *child_vdata;
  VectorDataIndex current_child_index;
  VectorDataIndex child_index;
  value_type *child_function;
  VectorDataIndex child_index_1;
  idx_t array_size;
  LogicalType *child_type;
  Vector *child_vector;
  ColumnDataCollectionSegment *segment;
  ColumnDataCollectionSegment *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  VectorChildIndex in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  VectorDataIndex in_stack_fffffffffffffe88;
  ulong local_150;
  ulong local_140;
  ulong local_130;
  ColumnDataMetaData local_110;
  UnifiedVectorFormat *in_stack_ffffffffffffff30;
  element_type *in_stack_ffffffffffffff38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff40;
  idx_t in_stack_ffffffffffffff48;
  Vector *in_stack_ffffffffffffff50;
  UnifiedVectorFormat *in_stack_ffffffffffffff58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff60;
  VectorDataIndex local_88;
  idx_t local_80;
  VectorDataIndex local_78;
  reference local_70;
  idx_t local_68;
  idx_t local_60;
  VectorDataIndex local_58;
  idx_t local_50;
  idx_t local_48;
  LogicalType *local_40;
  Vector *local_38;
  ColumnDataCollectionSegment *local_30;
  ulong local_28;
  long local_20;
  Vector *local_18;
  undefined8 *local_10;
  ColumnDataMetaData *local_8;
  
  local_30 = in_RDI->segment;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TemplatedColumnDataCopy<duckdb::StructValueCopy>
            ((ColumnDataMetaData *)in_stack_ffffffffffffff60._M_pi,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (idx_t)in_stack_ffffffffffffff40._M_pi);
  local_38 = ArrayVector::GetEntry((Vector *)0x2b68d4d);
  local_40 = Vector::GetType(local_38);
  Vector::GetType(local_18);
  local_48 = ArrayType::GetSize((LogicalType *)
                                CONCAT17(in_stack_fffffffffffffe77,
                                         CONCAT16(in_stack_fffffffffffffe76,
                                                  in_stack_fffffffffffffe70)));
  pVVar3 = ColumnDataMetaData::GetVectorMetaData
                     ((ColumnDataMetaData *)
                      CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  bVar1 = VectorChildIndex::IsValid(&pVVar3->child_index);
  if (!bVar1) {
    VectorDataIndex::VectorDataIndex(&local_58,0xffffffffffffffff);
    local_68 = (idx_t)ColumnDataCollectionSegment::AllocateVector
                                ((ColumnDataCollectionSegment *)
                                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                                 in_stack_fffffffffffffe78.index,
                                 (ChunkMetaData *)
                                 CONCAT17(in_stack_fffffffffffffe77,
                                          CONCAT16(in_stack_fffffffffffffe76,
                                                   in_stack_fffffffffffffe70)),
                                 (ColumnDataAppendState *)in_stack_fffffffffffffe68,
                                 in_stack_fffffffffffffe88);
    local_50 = local_68;
    local_60 = (idx_t)ColumnDataCollectionSegment::AddChildIndex
                                ((ColumnDataCollectionSegment *)
                                 CONCAT17(in_stack_fffffffffffffe77,
                                          CONCAT16(in_stack_fffffffffffffe76,
                                                   in_stack_fffffffffffffe70)),
                                 in_stack_fffffffffffffe78.index);
    pVVar3 = ColumnDataMetaData::GetVectorMetaData
                       ((ColumnDataMetaData *)
                        CONCAT17(in_stack_fffffffffffffe77,
                                 CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
    (pVVar3->child_index).index = local_60;
  }
  local_70 = vector<duckdb::ColumnDataCopyFunction,_true>::operator[]
                       ((vector<duckdb::ColumnDataCopyFunction,_true> *)
                        CONCAT17(in_stack_fffffffffffffe77,
                                 CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                        (size_type)in_stack_fffffffffffffe68);
  pVVar3 = ColumnDataMetaData::GetVectorMetaData
                     ((ColumnDataMetaData *)
                      CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  local_80 = (pVVar3->child_index).index;
  local_88 = ColumnDataCollectionSegment::GetChildIndex
                       ((ColumnDataCollectionSegment *)
                        CONCAT17(in_stack_fffffffffffffe77,
                                 CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                        in_stack_fffffffffffffe78,(idx_t)in_stack_fffffffffffffe68);
  local_78 = local_88;
  while (bVar1 = VectorDataIndex::IsValid(&local_88), bVar1) {
    index.index._6_1_ = in_stack_fffffffffffffe76;
    index.index._0_6_ = in_stack_fffffffffffffe70;
    index.index._7_1_ = in_stack_fffffffffffffe77;
    pVVar3 = ColumnDataCollectionSegment::GetVectorData(in_stack_fffffffffffffe68,index);
    local_88.index = (pVVar3->next_data).index;
  }
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  ColumnDataMetaData::ColumnDataMetaData(&local_110,local_70,local_8,local_78);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffff40._M_pi,(idx_t)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
  bVar1 = TemplatedValidityMask<unsigned_long>::IsMaskSet
                    ((TemplatedValidityMask<unsigned_long> *)(local_10 + 2));
  if (bVar1) {
    for (local_130 = 0; local_130 < local_28; local_130 = local_130 + 1) {
      this = (TemplatedValidityMask<unsigned_long> *)
             SelectionVector::get_index((SelectionVector *)*local_10,local_20 + local_130);
      in_stack_fffffffffffffe77 =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     (this,CONCAT17(in_stack_fffffffffffffe77,
                                    CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      if (!(bool)in_stack_fffffffffffffe77) {
        for (local_140 = 0; local_140 < local_48; local_140 = local_140 + 1) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)
                     CONCAT17(in_stack_fffffffffffffe77,
                              CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                     (idx_t)in_stack_fffffffffffffe68);
        }
      }
    }
  }
  VVar2 = Vector::GetVectorType(local_18);
  if (VVar2 == CONSTANT_VECTOR) {
    for (local_150 = 0; local_150 < local_28; local_150 = local_150 + 1) {
      (*local_70->function)
                (&local_110,(UnifiedVectorFormat *)&stack0xffffffffffffff20,local_38,0,local_48);
    }
  }
  else {
    (*local_70->function)
              (&local_110,(UnifiedVectorFormat *)&stack0xffffffffffffff20,local_38,
               local_20 * local_48,local_28 * local_48);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)
             CONCAT17(in_stack_fffffffffffffe77,CONCAT16(VVar2,in_stack_fffffffffffffe70)));
  return;
}

Assistant:

void ColumnDataCopyArray(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                         idx_t offset, idx_t copy_count) {

	auto &segment = meta_data.segment;

	// copy the NULL values for the main array vector (the same as for a struct vector)
	TemplatedColumnDataCopy<StructValueCopy>(meta_data, source_data, source, offset, copy_count);

	auto &child_vector = ArrayVector::GetEntry(source);
	auto &child_type = child_vector.GetType();
	auto array_size = ArrayType::GetSize(source.GetType());

	if (!meta_data.GetVectorMetaData().child_index.IsValid()) {
		auto child_index = segment.AllocateVector(child_type, meta_data.chunk_data, meta_data.state);
		meta_data.GetVectorMetaData().child_index = meta_data.segment.AddChildIndex(child_index);
	}

	auto &child_function = meta_data.copy_function.child_functions[0];
	auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index);

	auto current_child_index = child_index;
	while (current_child_index.IsValid()) {
		auto &child_vdata = segment.GetVectorData(current_child_index);
		current_child_index = child_vdata.next_data;
	}

	UnifiedVectorFormat child_vector_data;
	ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);
	child_vector.ToUnifiedFormat(copy_count * array_size, child_vector_data);

	// Broadcast and sync the validity of the array vector to the child vector

	if (source_data.validity.IsMaskSet()) {
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = source_data.sel->get_index(offset + i);
			if (!source_data.validity.RowIsValid(source_idx)) {
				for (idx_t j = 0; j < array_size; j++) {
					child_vector_data.validity.SetInvalid(source_idx * array_size + j);
				}
			}
		}
	}

	auto is_constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// If the array is constant, we need to copy the child vector n times
	if (is_constant) {
		for (idx_t i = 0; i < copy_count; i++) {
			child_function.function(child_meta_data, child_vector_data, child_vector, 0, array_size);
		}
	} else {
		child_function.function(child_meta_data, child_vector_data, child_vector, offset * array_size,
		                        copy_count * array_size);
	}
}